

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

void __thiscall Company::changeBoss(Company *this)

{
  Boss *pBVar1;
  int iVar2;
  Employee *this_00;
  double dVar3;
  double dVar4;
  Employee *temp;
  int numberOfEmployee;
  int i;
  Employee *max;
  Company *this_local;
  
  dVar3 = Employee::efficiency(&this->boss->super_Employee);
  if (dVar3 < 40.0) {
    this_00 = maxEfficiency(this);
    for (temp._4_4_ = 0; iVar2 = Boss::getNumberOfEmployees(this->boss), temp._4_4_ < iVar2;
        temp._4_4_ = temp._4_4_ + 1) {
      dVar3 = Employee::efficiency(this->employees[temp._4_4_]);
      dVar4 = Employee::efficiency(this_00);
      if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
        iVar2 = Boss::getNumberOfEmployees(this->boss);
        pBVar1 = this->boss;
        this->boss = (Boss *)this->employees[temp._4_4_];
        this->employees[temp._4_4_] = &pBVar1->super_Employee;
        Boss::setNumberOfEmployees(this->boss,iVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void Company::changeBoss() {

    if (boss->efficiency() < 40.0) {
        Employee *max = maxEfficiency(); // get the max efficiency
        for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
            if (employees[i]->efficiency() == max->efficiency()) {
                int numberOfEmployee = boss->getNumberOfEmployees();
                Employee *temp = boss; // store the value of boss
                boss = static_cast<Boss *>(employees[i]); // assign the max efficiency employee to boss with casting
                employees[i] = temp; // assign the boss which we stored earlier to that employee
                boss->setNumberOfEmployees(numberOfEmployee); // set the number of employees for the new boss
                break;
            }
        }
    }
}